

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_xyz_vol(REF_DBL **xyzs,REF_DBL *volume)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  
  pdVar4 = *xyzs;
  pdVar5 = xyzs[1];
  pdVar6 = xyzs[2];
  pdVar7 = xyzs[3];
  dVar1 = *pdVar7;
  dVar2 = pdVar7[1];
  dVar3 = pdVar7[2];
  *volume = (((*pdVar5 - dVar1) * (pdVar6[1] - dVar2) - (*pdVar6 - dVar1) * (pdVar5[1] - dVar2)) *
             (pdVar4[2] - dVar3) +
            (((pdVar5[1] - dVar2) * (pdVar6[2] - dVar3) - (pdVar5[2] - dVar3) * (pdVar6[1] - dVar2))
             * (*pdVar4 - dVar1) -
            ((pdVar6[2] - dVar3) * (*pdVar5 - dVar1) - (pdVar5[2] - dVar3) * (*pdVar6 - dVar1)) *
            (pdVar4[1] - dVar2))) / -6.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_xyz_vol(REF_DBL *xyzs[4], REF_DBL *volume) {
  REF_DBL *a, *b, *c, *d;
  REF_DBL m11, m12, m13;
  REF_DBL det;

  a = xyzs[0];
  b = xyzs[1];
  c = xyzs[2];
  d = xyzs[3];

  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  det = (m11 - m12 + m13);

  *volume = -det / 6.0;

  return REF_SUCCESS;
}